

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::merge
          (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
           *this,btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                 *src,allocator_type *alloc)

{
  ulong i;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_> bVar1
  ;
  ulong uVar2;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_> *c;
  char *__function;
  
  if ((((ulong)this & 7) == 0) && (((ulong)src & 7) == 0)) {
    uVar2 = *(ulong *)this;
    if (uVar2 != *(ulong *)src) {
      __assert_fail("parent() == src->parent()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x923,
                    "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::merge(btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                   );
    }
    if ((byte)this[8] + 1 != (uint)(byte)src[8]) {
      __assert_fail("position() + 1 == src->position()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x924,
                    "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::merge(btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                   );
    }
    if ((uVar2 & 7) == 0) {
      bVar1 = this[10];
      *(undefined4 *)(this + (ulong)(byte)bVar1 * 4 + 0xc) =
           *(undefined4 *)(uVar2 + 0xc + (ulong)(byte)this[8] * 4);
      uninitialized_move_n(src,(ulong)(byte)src[10],0,(ulong)(byte)bVar1 + 1,this,alloc);
      if (this[0xb] ==
          (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
           )0x0) {
        uVar2 = 0xffffffffffffffff;
        do {
          i = uVar2 + 1;
          bVar1 = this[10];
          c = child(src,i);
          init_child(this,(int)uVar2 + (uint)(byte)bVar1 + 2,c);
          mutable_child(src,i);
          uVar2 = i;
        } while (i < (byte)src[10]);
      }
      this[10] = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                  )((char)this[10] + (char)src[10] + '\x01');
      src[10] = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                 )0x0;
      remove_value(*(btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                     **)this,(uint)(byte)this[8],alloc);
      return;
    }
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
    ;
  }
  else {
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

void btree_node<P>::merge(btree_node *src, allocator_type *alloc) {
        assert(parent() == src->parent());
        assert(position() + 1 == src->position());

        // Move the delimiting value to the left node.
        value_init(count(), alloc, parent()->slot(position()));

        // Move the values from the right to the left node.
        src->uninitialized_move_n(src->count(), 0, count() + 1, this, alloc);

        // Destroy the now-empty entries in the right node.
        src->value_destroy_n(0, src->count(), alloc);

        if (!leaf()) {
            // Move the child pointers from the right to the left node.
            for (int i = 0; i <= src->count(); ++i) {
                init_child(count() + i + 1, src->child(i));
                src->clear_child(i);
            }
        }

        // Fixup the counts on the src and dest nodes.
        set_count((field_type)(1 + count() + src->count()));
        src->set_count(0);

        // Remove the value on the parent node.
        parent()->remove_value(position(), alloc);
    }